

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O0

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
::readFromFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *this,char *filename,Index rows,Index cols,bool withTimeStamp)

{
  byte bVar1;
  Scalar *pSVar2;
  long local_290;
  Index j;
  Index i;
  int k;
  bool continuation;
  undefined1 local_260 [8];
  Matrix m;
  istream local_238 [8];
  ifstream f;
  bool withTimeStamp_local;
  Index cols_local;
  Index rows_local;
  char *filename_local;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_local;
  
  reset(this);
  std::ifstream::ifstream(local_238);
  std::ifstream::open(local_238,filename,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((ConstantReturnType *)&k,rows,cols);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_260,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&k);
    i._7_1_ = 1;
    i._0_4_ = 0;
    while ((i._7_1_ & 1) != 0) {
      if (withTimeStamp) {
        std::istream::operator>>(local_238,(int *)&i);
      }
      bVar1 = std::ios::fail();
      if ((bVar1 & 1) == 0) {
        for (j = 0; j < rows; j = j + 1) {
          for (local_290 = 0; local_290 < cols; local_290 = local_290 + 1) {
            pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                                local_260,j,local_290);
            std::istream::operator>>(local_238,pSVar2);
          }
        }
        setValue(this,(Matrix<double,__1,__1,_0,__1,__1> *)local_260,(long)(int)i);
        i._0_4_ = (int)i + 1;
      }
      else {
        i._7_1_ = 0;
      }
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_260);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readFromFile(const char * filename, Index rows, Index cols, bool withTimeStamp)
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {

    Matrix m(Matrix::Zero(rows,cols));

    bool continuation=true;
    int k=0;

    while (continuation)
    {


      if (withTimeStamp)
      {
        f >> k;
      }


      if (f.fail())
        continuation=false;
      else
      {
        for (Index i = 0 ; i<rows; ++i)
        {
          for (Index j = 0 ; j<cols; ++j)
          {
            f >> m(i,j);
          }
        }

        setValue(m,k);
        ++k;
      }
    }
  }
}